

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  ImRect *pIVar1;
  ImVec2 *pIVar2;
  undefined8 *puVar3;
  int iVar4;
  ImGuiTabBar *pIVar5;
  ImGuiTabBar *__dest;
  int iVar6;
  int iVar7;
  
  iVar4 = this->FreeIdx;
  if (iVar4 == (this->Buf).Size) {
    iVar6 = iVar4 + 1;
    iVar7 = (this->Buf).Capacity;
    if (iVar4 < iVar7) {
      __dest = (this->Buf).Data;
      iVar7 = iVar6;
    }
    else {
      if (iVar7 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar7 / 2 + iVar7;
      }
      if (iVar7 <= iVar6) {
        iVar7 = iVar6;
      }
      __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar7 << 7);
      pIVar5 = (this->Buf).Data;
      if (pIVar5 != (ImGuiTabBar *)0x0) {
        memcpy(__dest,pIVar5,(long)(this->Buf).Size << 7);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar7;
      iVar7 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar6;
  }
  else {
    __dest = (this->Buf).Data;
    iVar7 = __dest[iVar4].Tabs.Size;
  }
  this->FreeIdx = iVar7;
  pIVar1 = &__dest[iVar4].BarRect;
  (pIVar1->Min).x = 0.0;
  (pIVar1->Min).y = 0.0;
  (pIVar1->Max).x = 0.0;
  (pIVar1->Max).y = 0.0;
  pIVar5 = __dest + iVar4;
  (pIVar5->Tabs).Size = 0;
  (pIVar5->Tabs).Capacity = 0;
  (pIVar5->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar5 = __dest + iVar4;
  pIVar5->ID = 0;
  pIVar5->SelectedTabId = 0;
  *(undefined8 *)(&pIVar5->ID + 2) = 0;
  pIVar2 = &__dest[iVar4].FramePadding;
  pIVar2->x = 0.0;
  pIVar2->y = 0.0;
  pIVar2[1].x = 0.0;
  pIVar2[1].y = 0.0;
  __dest[iVar4].TabsNames.Buf.Data = (char *)0x0;
  __dest[iVar4].CurrFrameVisible = -1;
  __dest[iVar4].PrevFrameVisible = -1;
  pIVar5 = __dest + iVar4;
  pIVar5->LastTabContentHeight = 0.0;
  pIVar5->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar5->LastTabContentHeight + 2) = 0;
  pIVar5 = __dest + iVar4;
  pIVar5->ScrollingAnim = 0.0;
  pIVar5->ScrollingTarget = 0.0;
  *(undefined8 *)(&pIVar5->ScrollingAnim + 2) = 0;
  puVar3 = (undefined8 *)((long)&__dest[iVar4].ScrollingTargetDistToVisibility + 3);
  *puVar3 = 0;
  puVar3[1] = 0;
  __dest[iVar4].LastTabItemIdx = -1;
  return (this->Buf).Data + iVar4;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }